

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O1

CommandSignature __thiscall
llbuild::buildsystem::ExternalCommand::getSignature(ExternalCommand *this)

{
  pointer ppBVar1;
  ExternalCommand *pEVar2;
  CommandSignature *pCVar3;
  size_t in_RDX;
  pointer ppBVar4;
  StringRef S;
  CommandSignature code;
  CommandSignature local_d0;
  ExternalCommand *local_c8;
  StringRef local_c0;
  hash_combine_recursive_helper local_b0;
  
  local_d0.value = 0;
  S.Length = in_RDX;
  S.Data = (char *)(this->super_Command).name._M_string_length;
  local_d0.value = (uint64_t)llvm::hash_value((llvm *)(this->super_Command).name._M_dataplus._M_p,S)
  ;
  ppBVar4 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_c8 = this;
  if (ppBVar4 != ppBVar1) {
    do {
      local_c0.Data = ((*ppBVar4)->super_Node).name._M_dataplus._M_p;
      local_c0.Length = ((*ppBVar4)->super_Node).name._M_string_length;
      llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_b0)
      ;
      local_b0.buffer[0] = (undefined1)local_d0.value;
      local_b0.buffer[1] = local_d0.value._1_1_;
      local_b0.buffer[2] = local_d0.value._2_1_;
      local_b0.buffer[3] = local_d0.value._3_1_;
      local_b0.buffer[4] = local_d0.value._4_1_;
      local_b0.buffer[5] = local_d0.value._5_1_;
      local_b0.buffer[6] = local_d0.value._6_1_;
      local_b0.buffer[7] = local_d0.value._7_1_;
      local_d0.value =
           (uint64_t)
           llvm::hashing::detail::hash_combine_recursive_helper::combine<llvm::StringRef>
                     (&local_b0,0,local_b0.buffer + 8,(char *)&local_b0.state,&local_c0);
      ppBVar4 = ppBVar4 + 1;
    } while (ppBVar4 != ppBVar1);
  }
  ppBVar4 = (local_c8->super_Command).outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (local_c8->super_Command).outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar4 != ppBVar1) {
    do {
      local_c0.Data = ((*ppBVar4)->super_Node).name._M_dataplus._M_p;
      local_c0.Length = ((*ppBVar4)->super_Node).name._M_string_length;
      llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_b0)
      ;
      local_b0.buffer[0] = (undefined1)local_d0.value;
      local_b0.buffer[1] = local_d0.value._1_1_;
      local_b0.buffer[2] = local_d0.value._2_1_;
      local_b0.buffer[3] = local_d0.value._3_1_;
      local_b0.buffer[4] = local_d0.value._4_1_;
      local_b0.buffer[5] = local_d0.value._5_1_;
      local_b0.buffer[6] = local_d0.value._6_1_;
      local_b0.buffer[7] = local_d0.value._7_1_;
      local_d0.value =
           (uint64_t)
           llvm::hashing::detail::hash_combine_recursive_helper::combine<llvm::StringRef>
                     (&local_b0,0,local_b0.buffer + 8,(char *)&local_b0.state,&local_c0);
      ppBVar4 = ppBVar4 + 1;
    } while (ppBVar4 != ppBVar1);
  }
  pEVar2 = local_c8;
  pCVar3 = basic::CommandSignature::combine(&local_d0,local_c8->allowMissingInputs);
  pCVar3 = basic::CommandSignature::combine(pCVar3,pEVar2->allowModifiedOutputs);
  pCVar3 = basic::CommandSignature::combine(pCVar3,pEVar2->alwaysOutOfDate);
  return (CommandSignature)pCVar3->value;
}

Assistant:

CommandSignature ExternalCommand::getSignature() const {
  CommandSignature code(getName());
  for (const auto* input: inputs) {
    code = code.combine(input->getName());
  }
  for (const auto* output: outputs) {
    code = code.combine(output->getName());
  }
  return code
      .combine(allowMissingInputs)
      .combine(allowModifiedOutputs)
      .combine(alwaysOutOfDate);
}